

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_multi.hpp
# Opt level: O2

unique_ptr<Kaaa,_std::default_delete<Kaaa>_> __thiscall
Infector::Container::build_delegate<Kaaa>(Container *this)

{
  iterator iVar1;
  iterator iVar2;
  __buckets_ptr pp_Var3;
  Container *in_RSI;
  __uniq_ptr_impl<Kaaa,_std::default_delete<Kaaa>_> local_20;
  
  local_20._M_t.super__Tuple_impl<0UL,_Kaaa_*,_std::default_delete<Kaaa>_>.
  super__Head_base<0UL,_Kaaa_*,_false>._M_head_impl =
       (tuple<Kaaa_*,_std::default_delete<Kaaa>_>)&Kaaa::typeinfo;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(in_RSI->typeMap)._M_h,(key_type *)&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur == (__node_type *)0x0) {
    launch_exception<Infector::ExBuildWhat>(in_RSI);
  }
  if (*(char *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      ._M_cur + 0x18) == '\x01') {
    launch_exception<Infector::ExSingleMulti>(in_RSI);
  }
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(in_RSI->callbacks)._M_h,
                 (key_type *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                        ._M_cur + 0x10));
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    launch_exception<Infector::ExNotWired>(in_RSI);
  }
  pp_Var3 = (__buckets_ptr)
            std::function<void_*(Infector::Container::EmplaceContext_*)>::operator()
                      ((function<void_*(Infector::Container::EmplaceContext_*)> *)
                       ((long)iVar2.
                              super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                              ._M_cur + 0x10),(EmplaceContext *)0x0);
  (this->singleIstances)._M_h._M_buckets = pp_Var3;
  local_20._M_t.super__Tuple_impl<0UL,_Kaaa_*,_std::default_delete<Kaaa>_>.
  super__Head_base<0UL,_Kaaa_*,_false>._M_head_impl =
       (tuple<Kaaa_*,_std::default_delete<Kaaa>_>)
       (_Tuple_impl<0UL,_Kaaa_*,_std::default_delete<Kaaa>_>)0x0;
  std::unique_ptr<Kaaa,_std::default_delete<Kaaa>_>::~unique_ptr
            ((unique_ptr<Kaaa,_std::default_delete<Kaaa>_> *)&local_20);
  return (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)
         (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> Container::build_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end())
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == true) ///!!!!!
            launch_exception<ExSingleMulti>(); // T must be multi

        auto it2 = callbacks.find( it->second.type ); //find constructor

        if( it2==callbacks.end() )
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        return std::move(
                    std::unique_ptr<T>(reinterpret_cast<T*>( (it2->second)(nullptr) ))
                    );
    }